

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

FILE * pugi::impl::anon_unknown_0::open_file_wide(wchar_t *path,wchar_t *mode)

{
  char *__filename;
  long in_RSI;
  FILE *result;
  size_t i;
  char mode_ascii [4];
  char *path_utf8;
  long local_30;
  wchar_t *in_stack_ffffffffffffffd8;
  FILE *local_8;
  
  __filename = convert_path_heap(in_stack_ffffffffffffffd8);
  if (__filename == (char *)0x0) {
    local_8 = (FILE *)0x0;
  }
  else {
    memset(&stack0xffffffffffffffdc,0,4);
    for (local_30 = 0; *(int *)(in_RSI + local_30 * 4) != 0; local_30 = local_30 + 1) {
      (&stack0xffffffffffffffdc)[local_30] = (char)*(undefined4 *)(in_RSI + local_30 * 4);
    }
    local_8 = fopen(__filename,&stack0xffffffffffffffdc);
    (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)
              (__filename);
  }
  return (FILE *)local_8;
}

Assistant:

PUGI__FN FILE* open_file_wide(const wchar_t* path, const wchar_t* mode)
	{
		// there is no standard function to open wide paths, so our best bet is to try utf8 path
		char* path_utf8 = convert_path_heap(path);
		if (!path_utf8) return 0;

		// convert mode to ASCII (we mirror _wfopen interface)
		char mode_ascii[4] = {0};
		for (size_t i = 0; mode[i]; ++i) mode_ascii[i] = static_cast<char>(mode[i]);

		// try to open the utf8 path
		FILE* result = fopen(path_utf8, mode_ascii);

		// free dummy buffer
		xml_memory::deallocate(path_utf8);

		return result;
	}